

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::Next
          (NodeSet *this,int32_t *cursor,int32_t *elem)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  int32_t v;
  int32_t *elem_local;
  int32_t *cursor_local;
  NodeSet *this_local;
  
  do {
    uVar1 = *cursor;
    uVar3 = Vec<int>::size(&this->table_);
    if (uVar3 <= uVar1) {
      return false;
    }
    piVar4 = Vec<int>::operator[](&this->table_,*cursor);
    iVar2 = *piVar4;
    *cursor = *cursor + 1;
  } while (iVar2 < 0);
  *elem = iVar2;
  return true;
}

Assistant:

bool Next(int32_t* cursor, int32_t* elem) {
    while (static_cast<uint32_t>(*cursor) < table_.size()) {
      int32_t v = table_[static_cast<uint32_t>(*cursor)];
      (*cursor)++;
      if (v >= 0) {
        *elem = v;
        return true;
      }
    }
    return false;
  }